

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 *pUVar1;
  BYTE *pBVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long *plVar10;
  int local_40;
  
  pUVar1 = ms->hashTable;
  pBVar2 = (ms->window).base;
  uVar8 = (ulong)ms->nextToUpdate;
  cVar3 = (char)(ms->cParams).hashLog;
  bVar4 = 0x40 - cVar3;
  bVar5 = 0x20 - cVar3;
  iVar9 = (ms->cParams).minMatch - 5;
  plVar10 = (long *)(pBVar2 + uVar8);
  do {
    if ((long *)((long)end + -6) <= (long *)((long)plVar10 + 3U)) {
      return;
    }
    switch(iVar9) {
    case 0:
      uVar6 = *plVar10 * -0x30e4432345000000;
      break;
    case 1:
      uVar6 = *plVar10 * -0x30e4432340650000;
      break;
    case 2:
      uVar6 = *plVar10 * -0x30e44323405a9d00;
      break;
    case 3:
      uVar6 = *plVar10 * -0x30e44323485a9b9d;
      break;
    default:
      uVar6 = (ulong)((uint)((int)*plVar10 * -0x61c8864f) >> (bVar5 & 0x1f));
      goto LAB_001ae8a3;
    }
    uVar6 = uVar6 >> (bVar4 & 0x3f);
LAB_001ae8a3:
    local_40 = (int)pBVar2;
    pUVar1[uVar6] = (int)plVar10 - local_40;
    if (dtlm != ZSTD_dtlm_fast) {
      for (lVar7 = 1; lVar7 != 3; lVar7 = lVar7 + 1) {
        switch(iVar9) {
        case 0:
          uVar6 = *(long *)((long)plVar10 + lVar7) * -0x30e4432345000000;
          break;
        case 1:
          uVar6 = *(long *)((long)plVar10 + lVar7) * -0x30e4432340650000;
          break;
        case 2:
          uVar6 = *(long *)((long)plVar10 + lVar7) * -0x30e44323405a9d00;
          break;
        case 3:
          uVar6 = *(long *)((long)plVar10 + lVar7) * -0x30e44323485a9b9d;
          break;
        default:
          uVar6 = (ulong)((uint)(*(int *)((long)plVar10 + lVar7) * -0x61c8864f) >> (bVar5 & 0x1f));
          goto LAB_001ae8ff;
        }
        uVar6 = uVar6 >> (bVar4 & 0x3f);
LAB_001ae8ff:
        if (pUVar1[uVar6] == 0) {
          pUVar1[uVar6] = (int)uVar8 + (int)lVar7;
        }
      }
    }
    uVar8 = uVar8 + 3;
    plVar10 = (long *)((long)plVar10 + 3U);
  } while( true );
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for ( ; ip + fastHashFillStep < iend + 2; ip += fastHashFillStep) {
        U32 const curr = (U32)(ip - base);
        size_t const hash0 = ZSTD_hashPtr(ip, hBits, mls);
        hashTable[hash0] = curr;
        if (dtlm == ZSTD_dtlm_fast) continue;
        /* Only load extra positions for ZSTD_dtlm_full */
        {   U32 p;
            for (p = 1; p < fastHashFillStep; ++p) {
                size_t const hash = ZSTD_hashPtr(ip + p, hBits, mls);
                if (hashTable[hash] == 0) {  /* not yet filled */
                    hashTable[hash] = curr + p;
    }   }   }   }
}